

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.hpp
# Opt level: O0

SmallBuffer * helics::ValueConverter<std::complex<double>_>::convert(complex<double> *val)

{
  complex<double> *in_RSI;
  SmallBuffer *in_RDI;
  SmallBuffer *dv;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar1;
  
  uVar1 = 0;
  SmallBuffer::SmallBuffer(in_RDI);
  convert(in_RSI,(SmallBuffer *)CONCAT17(uVar1,in_stack_ffffffffffffffe8));
  return in_RDI;
}

Assistant:

static SmallBuffer convert(const X& val)
    {
        auto dv = SmallBuffer();
        convert(val, dv);
        return dv;
    }